

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

ImageFeatureType_ImageSizeRange * __thiscall
CoreML::Specification::ImageFeatureType_ImageSizeRange::New
          (ImageFeatureType_ImageSizeRange *this,Arena *arena)

{
  ImageFeatureType_ImageSizeRange *this_00;
  ImageFeatureType_ImageSizeRange *n;
  Arena *arena_local;
  ImageFeatureType_ImageSizeRange *this_local;
  
  this_00 = (ImageFeatureType_ImageSizeRange *)operator_new(0x28);
  ImageFeatureType_ImageSizeRange(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ImageFeatureType_ImageSizeRange>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

ImageFeatureType_ImageSizeRange* ImageFeatureType_ImageSizeRange::New(::google::protobuf::Arena* arena) const {
  ImageFeatureType_ImageSizeRange* n = new ImageFeatureType_ImageSizeRange;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}